

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

Path * Path::canonicalized(Path *__return_storage_ptr__,Path *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  Path p;
  Path local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)path);
  sVar3 = canonicalize(&local_38);
  if (sVar3 == (path->super_String).mString._M_string_length) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  else {
    paVar1 = &(__return_storage_ptr__->super_String).mString.field_2;
    (__return_storage_ptr__->super_String).mString._M_dataplus._M_p = (pointer)paVar1;
    paVar2 = &local_38.super_String.mString.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.super_String.mString._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_38.super_String.mString.field_2._M_allocated_capacity._1_7_,
                    local_38.super_String.mString.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->super_String).mString.field_2 + 8) =
           local_38.super_String.mString.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->super_String).mString._M_dataplus._M_p =
           local_38.super_String.mString._M_dataplus._M_p;
      (__return_storage_ptr__->super_String).mString.field_2._M_allocated_capacity =
           CONCAT71(local_38.super_String.mString.field_2._M_allocated_capacity._1_7_,
                    local_38.super_String.mString.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->super_String).mString._M_string_length =
         local_38.super_String.mString._M_string_length;
    local_38.super_String.mString._M_string_length = 0;
    local_38.super_String.mString.field_2._M_local_buf[0] = '\0';
    local_38.super_String.mString._M_dataplus._M_p = (pointer)paVar2;
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Path Path::canonicalized(const Path &path)
{
    Path p = path;
    if (p.canonicalize() != path.size())
        return p;
    return path; // same as above
}